

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t k,real threshold,int32_t node,real score,
          Predictions *heap,Vector *hidden)

{
  int32_t node_00;
  int iVar1;
  pointer ppVar2;
  pointer pNVar3;
  element_type *peVar4;
  pointer ppVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  float fVar13;
  double dVar14;
  undefined1 auVar15 [64];
  float local_54;
  pair<float,_int> local_38;
  undefined1 extraout_var [56];
  
  local_54 = score;
  while( true ) {
    auVar15._0_8_ = log((double)threshold + 1e-05);
    auVar15._8_56_ = extraout_var;
    auVar12._0_4_ = (float)auVar15._0_8_;
    auVar12._4_12_ = auVar15._4_12_;
    if (local_54 < auVar12._0_4_) {
      return;
    }
    ppVar2 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3 == (long)k) &&
       (fVar13 = ppVar2->first, auVar12 = ZEXT416((uint)fVar13), local_54 < fVar13)) {
      return;
    }
    lVar8 = (long)node;
    pNVar3 = (this->tree_).
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pNVar3[lVar8].left == -1) && (pNVar3[lVar8].right == -1)) break;
    peVar4 = (((this->super_BinaryLogisticLoss).super_Loss.wo_)->
             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar4->_vptr_Matrix[2])(peVar4,hidden,lVar8 - this->osz_);
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar12,auVar7);
    fVar13 = expf(auVar12._0_4_);
    fVar13 = 1.0 / (fVar13 + 1.0);
    node_00 = (this->tree_).
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar8].left;
    dVar14 = log((double)(1.0 - fVar13) + 1e-05);
    dfs(this,k,threshold,node_00,(float)dVar14 + local_54,heap,hidden);
    node = (this->tree_).
           super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8].right;
    dVar14 = log((double)fVar13 + 1e-05);
    local_54 = (float)dVar14 + local_54;
  }
  local_38.first = local_54;
  local_38.second = node;
  std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
  emplace_back<std::pair<float,int>>
            ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38);
  ppVar2 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar13 = ppVar5[-1].first;
  iVar1 = ppVar5[-1].second;
  uVar9 = (long)ppVar5 - (long)ppVar2 >> 3;
  lVar8 = uVar9 - 1;
  if (1 < (long)uVar9) {
    do {
      lVar10 = (lVar8 + -1) - (lVar8 + -1 >> 0x3f) >> 1;
      if (ppVar2[lVar10].first <= fVar13) break;
      ppVar2[lVar8].first = ppVar2[lVar10].first;
      ppVar2[lVar8].second = ppVar2[lVar10].second;
      bVar6 = 2 < lVar8;
      lVar8 = lVar10;
    } while (bVar6);
  }
  ppVar2[lVar8].first = fVar13;
  ppVar2[lVar8].second = iVar1;
  if ((ulong)(long)k < uVar9) {
    if (8 < (long)ppVar5 - (long)ppVar2) {
      fVar13 = ppVar5[-1].first;
      iVar1 = ppVar5[-1].second;
      ppVar5[-1].first = ppVar2->first;
      ppVar5[-1].second = ppVar2->second;
      uVar9 = (long)(ppVar5 + -1) - (long)ppVar2;
      lVar8 = (long)uVar9 >> 3;
      if (lVar8 < 3) {
        lVar10 = 0;
      }
      else {
        lVar11 = 0;
        do {
          if (ppVar2[lVar11 * 2 + 1].first < ppVar2[lVar11 * 2 + 2].first) {
            lVar10 = lVar11 * 2 + 1;
          }
          else {
            lVar10 = lVar11 * 2 + 2;
          }
          ppVar2[lVar11].first = ppVar2[lVar10].first;
          ppVar2[lVar11].second = ppVar2[lVar10].second;
          lVar11 = lVar10;
        } while (lVar10 < (lVar8 + -1) - (lVar8 + -1 >> 0x3f) >> 1);
      }
      if (((uVar9 & 8) == 0) && (lVar10 == lVar8 + -2 >> 1)) {
        ppVar2[lVar10].first = ppVar2[lVar10 * 2 + 1].first;
        ppVar2[lVar10].second = ppVar2[lVar10 * 2 + 1].second;
        lVar10 = lVar10 * 2 + 1;
      }
      if (0 < lVar10) {
        do {
          lVar8 = (lVar10 + -1) - (lVar10 + -1 >> 0x3f) >> 1;
          if (ppVar2[lVar8].first <= fVar13) break;
          ppVar2[lVar10].first = ppVar2[lVar8].first;
          ppVar2[lVar10].second = ppVar2[lVar8].second;
          bVar6 = 2 < lVar10;
          lVar10 = lVar8;
        } while (bVar6);
      }
      ppVar2[lVar10].first = fVar13;
      ppVar2[lVar10].second = iVar1;
    }
    (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t k,
    real threshold,
    int32_t node,
    real score,
    Predictions& heap,
    const Vector& hidden) const {
  if (score < std_log(threshold)) {
    return;
  }
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(k, threshold, tree_[node].left, score + std_log(1.0 - f), heap, hidden);
  dfs(k, threshold, tree_[node].right, score + std_log(f), heap, hidden);
}